

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O0

void ncnn::convdw5x5s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _k44_1;
  __m128 _k43_1;
  __m128 _k42_1;
  __m128 _k41_1;
  __m128 _k40_1;
  __m128 _r44_1;
  __m128 _r43_1;
  __m128 _r42_1;
  __m128 _r41_1;
  __m128 _r40_1;
  __m128 _k34_1;
  __m128 _k33_1;
  __m128 _k32_1;
  __m128 _k31_1;
  __m128 _k30_1;
  __m128 _r34_1;
  __m128 _r33_1;
  __m128 _r32_1;
  __m128 _r31_1;
  __m128 _r30_1;
  __m128 _k24_1;
  __m128 _k23_1;
  __m128 _k22_1;
  __m128 _k21_1;
  __m128 _k20_1;
  __m128 _r24_1;
  __m128 _r23_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _k14_1;
  __m128 _k13_1;
  __m128 _k12_1;
  __m128 _k11_1;
  __m128 _k10_1;
  __m128 _r14_1;
  __m128 _r13_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _k04_1;
  __m128 _k03_1;
  __m128 _k02_1;
  __m128 _k01_1;
  __m128 _k00_1;
  __m128 _r04_1;
  __m128 _r03_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  int j_1;
  __m128 _r54;
  __m128 _r53;
  __m128 _r52;
  __m128 _r51;
  __m128 _r50;
  __m128 _k44;
  __m128 _k43;
  __m128 _k42;
  __m128 _k41;
  __m128 _k40;
  __m128 _r44;
  __m128 _r43;
  __m128 _r42;
  __m128 _r41;
  __m128 _r40;
  __m128 _k34;
  __m128 _k33;
  __m128 _k32;
  __m128 _k31;
  __m128 _k30;
  __m128 _r34;
  __m128 _r33;
  __m128 _r32;
  __m128 _r31;
  __m128 _r30;
  __m128 _k24;
  __m128 _k23;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _r24;
  __m128 _r23;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _k14;
  __m128 _k13;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _r14;
  __m128 _r13;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _k04;
  __m128 _k03;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum1;
  __m128 _sum0;
  int j;
  int i;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr1;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  int local_2b8c;
  int local_27f0;
  int local_27ec;
  undefined8 *local_27e8;
  undefined8 *local_27e0;
  undefined8 *local_27d8;
  undefined8 *local_27d0;
  undefined8 *local_27c8;
  undefined8 *local_27c0;
  undefined8 *local_2770;
  undefined8 *local_2768;
  int local_26ec;
  float local_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float local_20c8;
  float fStack_20c4;
  float fStack_20c0;
  float fStack_20bc;
  float local_2068;
  float fStack_2064;
  float fStack_2060;
  float fStack_205c;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  float local_1fe8;
  float fStack_1fe4;
  float fStack_1fe0;
  float fStack_1fdc;
  float local_1f88;
  float fStack_1f84;
  float fStack_1f80;
  float fStack_1f7c;
  float local_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float local_1f08;
  float fStack_1f04;
  float fStack_1f00;
  float fStack_1efc;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float local_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float local_1e28;
  float fStack_1e24;
  float fStack_1e20;
  float fStack_1e1c;
  float local_1dc8;
  float fStack_1dc4;
  float fStack_1dc0;
  float fStack_1dbc;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float local_1d48;
  float fStack_1d44;
  float fStack_1d40;
  float fStack_1d3c;
  float local_1ce8;
  float fStack_1ce4;
  float fStack_1ce0;
  float fStack_1cdc;
  float local_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  float local_1c08;
  float fStack_1c04;
  float fStack_1c00;
  float fStack_1bfc;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float local_1b88;
  float fStack_1b84;
  float fStack_1b80;
  float fStack_1b7c;
  float local_1b28;
  float fStack_1b24;
  float fStack_1b20;
  float fStack_1b1c;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float local_1aa8;
  float fStack_1aa4;
  float fStack_1aa0;
  float fStack_1a9c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_1808;
  float fStack_1804;
  float fStack_1800;
  float fStack_17fc;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  float local_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_16c8;
  float fStack_16c4;
  float fStack_16c0;
  float fStack_16bc;
  float local_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float local_1648;
  float fStack_1644;
  float fStack_1640;
  float fStack_163c;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float fStack_14fc;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar6 = in_RSI[6];
  lVar7 = in_RDI[7];
  lVar4 = *in_RCX;
  for (local_26ec = 0; local_26ec < (int)lVar7; local_26ec = local_26ec + 1) {
    local_2768 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_26ec * in_RSI[2]);
    if (lVar4 == 0) {
      local_2f08 = 0;
      uStack_2f00 = 0;
    }
    else {
      puVar8 = (undefined8 *)(lVar4 + (long)(local_26ec << 2) * 4);
      local_2f08 = *puVar8;
      uStack_2f00 = puVar8[1];
    }
    puVar8 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_26ec * in_RDX[2]);
    local_2770 = (undefined8 *)((long)local_2768 + (long)*(int *)((long)in_RSI + 0x2c) * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    local_27c0 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_26ec * in_RDI[2]);
    lVar5 = in_RDI[2];
    local_27c8 = (undefined8 *)((long)local_27c0 + iVar3 * lVar5);
    local_27d0 = (undefined8 *)((long)local_27c0 + (long)iVar3 * 2 * lVar5);
    local_27d8 = (undefined8 *)((long)local_27c0 + (long)iVar3 * 3 * lVar5);
    local_27e0 = (undefined8 *)((long)local_27c0 + (long)iVar3 * 4 * lVar5);
    local_27e8 = (undefined8 *)((long)local_27c0 + (long)iVar3 * 5 * lVar5);
    local_27ec = 0;
    while( true ) {
      local_98 = (float)local_2f08;
      fStack_94 = (float)((ulong)local_2f08 >> 0x20);
      fStack_90 = (float)uStack_2f00;
      fStack_8c = (float)((ulong)uStack_2f00 >> 0x20);
      if ((int)lVar6 <= local_27ec + 1) break;
      for (local_27f0 = 0; local_27f0 < iVar2; local_27f0 = local_27f0 + 1) {
        local_68 = (float)*puVar8;
        fStack_64 = (float)((ulong)*puVar8 >> 0x20);
        fStack_60 = (float)puVar8[1];
        fStack_5c = (float)((ulong)puVar8[1] >> 0x20);
        local_78 = (float)*local_27c0;
        fStack_74 = (float)((ulong)*local_27c0 >> 0x20);
        fStack_70 = (float)local_27c0[1];
        fStack_6c = (float)((ulong)local_27c0[1] >> 0x20);
        local_d8 = (float)puVar8[2];
        fStack_d4 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_d0 = (float)puVar8[3];
        fStack_cc = (float)((ulong)puVar8[3] >> 0x20);
        local_e8 = (float)local_27c0[2];
        fStack_e4 = (float)((ulong)local_27c0[2] >> 0x20);
        fStack_e0 = (float)local_27c0[3];
        fStack_dc = (float)((ulong)local_27c0[3] >> 0x20);
        local_148 = (float)puVar8[4];
        fStack_144 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_140 = (float)puVar8[5];
        fStack_13c = (float)((ulong)puVar8[5] >> 0x20);
        local_158 = (float)local_27c0[4];
        fStack_154 = (float)((ulong)local_27c0[4] >> 0x20);
        fStack_150 = (float)local_27c0[5];
        fStack_14c = (float)((ulong)local_27c0[5] >> 0x20);
        local_1b8 = (float)puVar8[6];
        fStack_1b4 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_1b0 = (float)puVar8[7];
        fStack_1ac = (float)((ulong)puVar8[7] >> 0x20);
        local_1c8 = (float)local_27c0[6];
        fStack_1c4 = (float)((ulong)local_27c0[6] >> 0x20);
        fStack_1c0 = (float)local_27c0[7];
        fStack_1bc = (float)((ulong)local_27c0[7] >> 0x20);
        local_228 = (float)puVar8[8];
        fStack_224 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_220 = (float)puVar8[9];
        fStack_21c = (float)((ulong)puVar8[9] >> 0x20);
        local_238 = (float)local_27c0[8];
        fStack_234 = (float)((ulong)local_27c0[8] >> 0x20);
        fStack_230 = (float)local_27c0[9];
        fStack_22c = (float)((ulong)local_27c0[9] >> 0x20);
        local_2a8 = (float)*local_27c8;
        fStack_2a4 = (float)((ulong)*local_27c8 >> 0x20);
        fStack_2a0 = (float)local_27c8[1];
        fStack_29c = (float)((ulong)local_27c8[1] >> 0x20);
        local_318 = (float)local_27c8[2];
        fStack_314 = (float)((ulong)local_27c8[2] >> 0x20);
        fStack_310 = (float)local_27c8[3];
        fStack_30c = (float)((ulong)local_27c8[3] >> 0x20);
        local_388 = (float)local_27c8[4];
        fStack_384 = (float)((ulong)local_27c8[4] >> 0x20);
        fStack_380 = (float)local_27c8[5];
        fStack_37c = (float)((ulong)local_27c8[5] >> 0x20);
        local_3f8 = (float)local_27c8[6];
        fStack_3f4 = (float)((ulong)local_27c8[6] >> 0x20);
        fStack_3f0 = (float)local_27c8[7];
        fStack_3ec = (float)((ulong)local_27c8[7] >> 0x20);
        local_468 = (float)local_27c8[8];
        fStack_464 = (float)((ulong)local_27c8[8] >> 0x20);
        fStack_460 = (float)local_27c8[9];
        fStack_45c = (float)((ulong)local_27c8[9] >> 0x20);
        local_4c8 = (float)puVar8[10];
        fStack_4c4 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_4c0 = (float)puVar8[0xb];
        fStack_4bc = (float)((ulong)puVar8[0xb] >> 0x20);
        local_538 = (float)puVar8[0xc];
        fStack_534 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_530 = (float)puVar8[0xd];
        fStack_52c = (float)((ulong)puVar8[0xd] >> 0x20);
        local_5a8 = (float)puVar8[0xe];
        fStack_5a4 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_5a0 = (float)puVar8[0xf];
        fStack_59c = (float)((ulong)puVar8[0xf] >> 0x20);
        local_618 = (float)puVar8[0x10];
        fStack_614 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_610 = (float)puVar8[0x11];
        fStack_60c = (float)((ulong)puVar8[0x11] >> 0x20);
        local_688 = (float)puVar8[0x12];
        fStack_684 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_680 = (float)puVar8[0x13];
        fStack_67c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_708 = (float)*local_27d0;
        fStack_704 = (float)((ulong)*local_27d0 >> 0x20);
        fStack_700 = (float)local_27d0[1];
        fStack_6fc = (float)((ulong)local_27d0[1] >> 0x20);
        local_778 = (float)local_27d0[2];
        fStack_774 = (float)((ulong)local_27d0[2] >> 0x20);
        fStack_770 = (float)local_27d0[3];
        fStack_76c = (float)((ulong)local_27d0[3] >> 0x20);
        local_7e8 = (float)local_27d0[4];
        fStack_7e4 = (float)((ulong)local_27d0[4] >> 0x20);
        fStack_7e0 = (float)local_27d0[5];
        fStack_7dc = (float)((ulong)local_27d0[5] >> 0x20);
        local_858 = (float)local_27d0[6];
        fStack_854 = (float)((ulong)local_27d0[6] >> 0x20);
        fStack_850 = (float)local_27d0[7];
        fStack_84c = (float)((ulong)local_27d0[7] >> 0x20);
        local_8c8 = (float)local_27d0[8];
        fStack_8c4 = (float)((ulong)local_27d0[8] >> 0x20);
        fStack_8c0 = (float)local_27d0[9];
        fStack_8bc = (float)((ulong)local_27d0[9] >> 0x20);
        local_928 = (float)puVar8[0x14];
        fStack_924 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_920 = (float)puVar8[0x15];
        fStack_91c = (float)((ulong)puVar8[0x15] >> 0x20);
        local_998 = (float)puVar8[0x16];
        fStack_994 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_990 = (float)puVar8[0x17];
        fStack_98c = (float)((ulong)puVar8[0x17] >> 0x20);
        local_a08 = (float)puVar8[0x18];
        fStack_a04 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_a00 = (float)puVar8[0x19];
        fStack_9fc = (float)((ulong)puVar8[0x19] >> 0x20);
        local_a78 = (float)puVar8[0x1a];
        fStack_a74 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_a70 = (float)puVar8[0x1b];
        fStack_a6c = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_ae8 = (float)puVar8[0x1c];
        fStack_ae4 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_ae0 = (float)puVar8[0x1d];
        fStack_adc = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_b68 = (float)*local_27d8;
        fStack_b64 = (float)((ulong)*local_27d8 >> 0x20);
        fStack_b60 = (float)local_27d8[1];
        fStack_b5c = (float)((ulong)local_27d8[1] >> 0x20);
        local_bd8 = (float)local_27d8[2];
        fStack_bd4 = (float)((ulong)local_27d8[2] >> 0x20);
        fStack_bd0 = (float)local_27d8[3];
        fStack_bcc = (float)((ulong)local_27d8[3] >> 0x20);
        local_c48 = (float)local_27d8[4];
        fStack_c44 = (float)((ulong)local_27d8[4] >> 0x20);
        fStack_c40 = (float)local_27d8[5];
        fStack_c3c = (float)((ulong)local_27d8[5] >> 0x20);
        local_cb8 = (float)local_27d8[6];
        fStack_cb4 = (float)((ulong)local_27d8[6] >> 0x20);
        fStack_cb0 = (float)local_27d8[7];
        fStack_cac = (float)((ulong)local_27d8[7] >> 0x20);
        local_d28 = (float)local_27d8[8];
        fStack_d24 = (float)((ulong)local_27d8[8] >> 0x20);
        fStack_d20 = (float)local_27d8[9];
        fStack_d1c = (float)((ulong)local_27d8[9] >> 0x20);
        local_d88 = (float)puVar8[0x1e];
        fStack_d84 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_d80 = (float)puVar8[0x1f];
        fStack_d7c = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_df8 = (float)puVar8[0x20];
        fStack_df4 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_df0 = (float)puVar8[0x21];
        fStack_dec = (float)((ulong)puVar8[0x21] >> 0x20);
        local_e68 = (float)puVar8[0x22];
        fStack_e64 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_e60 = (float)puVar8[0x23];
        fStack_e5c = (float)((ulong)puVar8[0x23] >> 0x20);
        local_ed8 = (float)puVar8[0x24];
        fStack_ed4 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_ed0 = (float)puVar8[0x25];
        fStack_ecc = (float)((ulong)puVar8[0x25] >> 0x20);
        local_f48 = (float)puVar8[0x26];
        fStack_f44 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_f40 = (float)puVar8[0x27];
        fStack_f3c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_fc8 = (float)*local_27e0;
        fStack_fc4 = (float)((ulong)*local_27e0 >> 0x20);
        fStack_fc0 = (float)local_27e0[1];
        fStack_fbc = (float)((ulong)local_27e0[1] >> 0x20);
        local_1038 = (float)local_27e0[2];
        fStack_1034 = (float)((ulong)local_27e0[2] >> 0x20);
        fStack_1030 = (float)local_27e0[3];
        fStack_102c = (float)((ulong)local_27e0[3] >> 0x20);
        local_10a8 = (float)local_27e0[4];
        fStack_10a4 = (float)((ulong)local_27e0[4] >> 0x20);
        fStack_10a0 = (float)local_27e0[5];
        fStack_109c = (float)((ulong)local_27e0[5] >> 0x20);
        local_1118 = (float)local_27e0[6];
        fStack_1114 = (float)((ulong)local_27e0[6] >> 0x20);
        fStack_1110 = (float)local_27e0[7];
        fStack_110c = (float)((ulong)local_27e0[7] >> 0x20);
        local_1188 = (float)local_27e0[8];
        fStack_1184 = (float)((ulong)local_27e0[8] >> 0x20);
        fStack_1180 = (float)local_27e0[9];
        fStack_117c = (float)((ulong)local_27e0[9] >> 0x20);
        local_11e8 = (float)puVar8[0x28];
        fStack_11e4 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_11e0 = (float)puVar8[0x29];
        fStack_11dc = (float)((ulong)puVar8[0x29] >> 0x20);
        local_1258 = (float)puVar8[0x2a];
        fStack_1254 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_1250 = (float)puVar8[0x2b];
        fStack_124c = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_12c8 = (float)puVar8[0x2c];
        fStack_12c4 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_12c0 = (float)puVar8[0x2d];
        fStack_12bc = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_1338 = (float)puVar8[0x2e];
        fStack_1334 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_1330 = (float)puVar8[0x2f];
        fStack_132c = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_13a8 = (float)puVar8[0x30];
        fStack_13a4 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_13a0 = (float)puVar8[0x31];
        fStack_139c = (float)((ulong)puVar8[0x31] >> 0x20);
        local_1428 = (float)*local_27e8;
        fStack_1424 = (float)((ulong)*local_27e8 >> 0x20);
        fStack_1420 = (float)local_27e8[1];
        fStack_141c = (float)((ulong)local_27e8[1] >> 0x20);
        local_1498 = (float)local_27e8[2];
        fStack_1494 = (float)((ulong)local_27e8[2] >> 0x20);
        fStack_1490 = (float)local_27e8[3];
        fStack_148c = (float)((ulong)local_27e8[3] >> 0x20);
        local_1508 = (float)local_27e8[4];
        fStack_1504 = (float)((ulong)local_27e8[4] >> 0x20);
        fStack_1500 = (float)local_27e8[5];
        fStack_14fc = (float)((ulong)local_27e8[5] >> 0x20);
        local_1578 = (float)local_27e8[6];
        fStack_1574 = (float)((ulong)local_27e8[6] >> 0x20);
        fStack_1570 = (float)local_27e8[7];
        fStack_156c = (float)((ulong)local_27e8[7] >> 0x20);
        local_15e8 = (float)local_27e8[8];
        fStack_15e4 = (float)((ulong)local_27e8[8] >> 0x20);
        fStack_15e0 = (float)local_27e8[9];
        fStack_15dc = (float)((ulong)local_27e8[9] >> 0x20);
        *local_2768 = CONCAT44(fStack_13a4 * fStack_1184 +
                               fStack_1334 * fStack_1114 +
                               fStack_12c4 * fStack_10a4 +
                               fStack_1254 * fStack_1034 +
                               fStack_11e4 * fStack_fc4 +
                               fStack_f44 * fStack_d24 +
                               fStack_ed4 * fStack_cb4 +
                               fStack_e64 * fStack_c44 +
                               fStack_df4 * fStack_bd4 +
                               fStack_d84 * fStack_b64 +
                               fStack_ae4 * fStack_8c4 +
                               fStack_a74 * fStack_854 +
                               fStack_a04 * fStack_7e4 +
                               fStack_994 * fStack_774 +
                               fStack_924 * fStack_704 +
                               fStack_684 * fStack_464 +
                               fStack_614 * fStack_3f4 +
                               fStack_5a4 * fStack_384 +
                               fStack_534 * fStack_314 +
                               fStack_4c4 * fStack_2a4 +
                               fStack_224 * fStack_234 +
                               fStack_1b4 * fStack_1c4 +
                               fStack_144 * fStack_154 +
                               fStack_d4 * fStack_e4 + fStack_64 * fStack_74 + fStack_94,
                               local_13a8 * local_1188 +
                               local_1338 * local_1118 +
                               local_12c8 * local_10a8 +
                               local_1258 * local_1038 +
                               local_11e8 * local_fc8 +
                               local_f48 * local_d28 +
                               local_ed8 * local_cb8 +
                               local_e68 * local_c48 +
                               local_df8 * local_bd8 +
                               local_d88 * local_b68 +
                               local_ae8 * local_8c8 +
                               local_a78 * local_858 +
                               local_a08 * local_7e8 +
                               local_998 * local_778 +
                               local_928 * local_708 +
                               local_688 * local_468 +
                               local_618 * local_3f8 +
                               local_5a8 * local_388 +
                               local_538 * local_318 +
                               local_4c8 * local_2a8 +
                               local_228 * local_238 +
                               local_1b8 * local_1c8 +
                               local_148 * local_158 +
                               local_d8 * local_e8 + local_68 * local_78 + local_98);
        local_2768[1] =
             CONCAT44(fStack_139c * fStack_117c +
                      fStack_132c * fStack_110c +
                      fStack_12bc * fStack_109c +
                      fStack_124c * fStack_102c +
                      fStack_11dc * fStack_fbc +
                      fStack_f3c * fStack_d1c +
                      fStack_ecc * fStack_cac +
                      fStack_e5c * fStack_c3c +
                      fStack_dec * fStack_bcc +
                      fStack_d7c * fStack_b5c +
                      fStack_adc * fStack_8bc +
                      fStack_a6c * fStack_84c +
                      fStack_9fc * fStack_7dc +
                      fStack_98c * fStack_76c +
                      fStack_91c * fStack_6fc +
                      fStack_67c * fStack_45c +
                      fStack_60c * fStack_3ec +
                      fStack_59c * fStack_37c +
                      fStack_52c * fStack_30c +
                      fStack_4bc * fStack_29c +
                      fStack_21c * fStack_22c +
                      fStack_1ac * fStack_1bc +
                      fStack_13c * fStack_14c +
                      fStack_cc * fStack_dc + fStack_5c * fStack_6c + fStack_8c,
                      fStack_13a0 * fStack_1180 +
                      fStack_1330 * fStack_1110 +
                      fStack_12c0 * fStack_10a0 +
                      fStack_1250 * fStack_1030 +
                      fStack_11e0 * fStack_fc0 +
                      fStack_f40 * fStack_d20 +
                      fStack_ed0 * fStack_cb0 +
                      fStack_e60 * fStack_c40 +
                      fStack_df0 * fStack_bd0 +
                      fStack_d80 * fStack_b60 +
                      fStack_ae0 * fStack_8c0 +
                      fStack_a70 * fStack_850 +
                      fStack_a00 * fStack_7e0 +
                      fStack_990 * fStack_770 +
                      fStack_920 * fStack_700 +
                      fStack_680 * fStack_460 +
                      fStack_610 * fStack_3f0 +
                      fStack_5a0 * fStack_380 +
                      fStack_530 * fStack_310 +
                      fStack_4c0 * fStack_2a0 +
                      fStack_220 * fStack_230 +
                      fStack_1b0 * fStack_1c0 +
                      fStack_140 * fStack_150 +
                      fStack_d0 * fStack_e0 + fStack_60 * fStack_70 + fStack_90);
        *local_2770 = CONCAT44(fStack_13a4 * fStack_15e4 +
                               fStack_1334 * fStack_1574 +
                               fStack_12c4 * fStack_1504 +
                               fStack_1254 * fStack_1494 +
                               fStack_11e4 * fStack_1424 +
                               fStack_f44 * fStack_1184 +
                               fStack_ed4 * fStack_1114 +
                               fStack_e64 * fStack_10a4 +
                               fStack_df4 * fStack_1034 +
                               fStack_d84 * fStack_fc4 +
                               fStack_ae4 * fStack_d24 +
                               fStack_a74 * fStack_cb4 +
                               fStack_a04 * fStack_c44 +
                               fStack_994 * fStack_bd4 +
                               fStack_924 * fStack_b64 +
                               fStack_684 * fStack_8c4 +
                               fStack_614 * fStack_854 +
                               fStack_5a4 * fStack_7e4 +
                               fStack_534 * fStack_774 +
                               fStack_4c4 * fStack_704 +
                               fStack_224 * fStack_464 +
                               fStack_1b4 * fStack_3f4 +
                               fStack_144 * fStack_384 +
                               fStack_d4 * fStack_314 + fStack_64 * fStack_2a4 + fStack_94,
                               local_13a8 * local_15e8 +
                               local_1338 * local_1578 +
                               local_12c8 * local_1508 +
                               local_1258 * local_1498 +
                               local_11e8 * local_1428 +
                               local_f48 * local_1188 +
                               local_ed8 * local_1118 +
                               local_e68 * local_10a8 +
                               local_df8 * local_1038 +
                               local_d88 * local_fc8 +
                               local_ae8 * local_d28 +
                               local_a78 * local_cb8 +
                               local_a08 * local_c48 +
                               local_998 * local_bd8 +
                               local_928 * local_b68 +
                               local_688 * local_8c8 +
                               local_618 * local_858 +
                               local_5a8 * local_7e8 +
                               local_538 * local_778 +
                               local_4c8 * local_708 +
                               local_228 * local_468 +
                               local_1b8 * local_3f8 +
                               local_148 * local_388 +
                               local_d8 * local_318 + local_68 * local_2a8 + local_98);
        local_2770[1] =
             CONCAT44(fStack_139c * fStack_15dc +
                      fStack_132c * fStack_156c +
                      fStack_12bc * fStack_14fc +
                      fStack_124c * fStack_148c +
                      fStack_11dc * fStack_141c +
                      fStack_f3c * fStack_117c +
                      fStack_ecc * fStack_110c +
                      fStack_e5c * fStack_109c +
                      fStack_dec * fStack_102c +
                      fStack_d7c * fStack_fbc +
                      fStack_adc * fStack_d1c +
                      fStack_a6c * fStack_cac +
                      fStack_9fc * fStack_c3c +
                      fStack_98c * fStack_bcc +
                      fStack_91c * fStack_b5c +
                      fStack_67c * fStack_8bc +
                      fStack_60c * fStack_84c +
                      fStack_59c * fStack_7dc +
                      fStack_52c * fStack_76c +
                      fStack_4bc * fStack_6fc +
                      fStack_21c * fStack_45c +
                      fStack_1ac * fStack_3ec +
                      fStack_13c * fStack_37c +
                      fStack_cc * fStack_30c + fStack_5c * fStack_29c + fStack_8c,
                      fStack_13a0 * fStack_15e0 +
                      fStack_1330 * fStack_1570 +
                      fStack_12c0 * fStack_1500 +
                      fStack_1250 * fStack_1490 +
                      fStack_11e0 * fStack_1420 +
                      fStack_f40 * fStack_1180 +
                      fStack_ed0 * fStack_1110 +
                      fStack_e60 * fStack_10a0 +
                      fStack_df0 * fStack_1030 +
                      fStack_d80 * fStack_fc0 +
                      fStack_ae0 * fStack_d20 +
                      fStack_a70 * fStack_cb0 +
                      fStack_a00 * fStack_c40 +
                      fStack_990 * fStack_bd0 +
                      fStack_920 * fStack_b60 +
                      fStack_680 * fStack_8c0 +
                      fStack_610 * fStack_850 +
                      fStack_5a0 * fStack_7e0 +
                      fStack_530 * fStack_770 +
                      fStack_4c0 * fStack_700 +
                      fStack_220 * fStack_460 +
                      fStack_1b0 * fStack_3f0 +
                      fStack_140 * fStack_380 +
                      fStack_d0 * fStack_310 + fStack_60 * fStack_2a0 + fStack_90);
        local_2768 = local_2768 + 2;
        local_2770 = local_2770 + 2;
        local_27c0 = local_27c0 + 2;
        local_27c8 = local_27c8 + 2;
        local_27d0 = local_27d0 + 2;
        local_27d8 = local_27d8 + 2;
        local_27e0 = local_27e0 + 2;
        local_27e8 = local_27e8 + 2;
      }
      local_27c0 = (undefined8 *)((long)local_27c0 + (long)(iVar1 * 4 + 0x10) * 4);
      local_27c8 = (undefined8 *)((long)local_27c8 + (long)(iVar1 * 4 + 0x10) * 4);
      local_27d0 = (undefined8 *)((long)local_27d0 + (long)(iVar1 * 4 + 0x10) * 4);
      local_27d8 = (undefined8 *)((long)local_27d8 + (long)(iVar1 * 4 + 0x10) * 4);
      local_27e0 = (undefined8 *)((long)local_27e0 + (long)(iVar1 * 4 + 0x10) * 4);
      local_27e8 = (undefined8 *)((long)local_27e8 + (long)(iVar1 * 4 + 0x10) * 4);
      local_2768 = (undefined8 *)((long)local_2768 + (long)(iVar2 << 2) * 4);
      local_2770 = (undefined8 *)((long)local_2770 + (long)(iVar2 << 2) * 4);
      local_27ec = local_27ec + 2;
    }
    for (; local_27ec < (int)lVar6; local_27ec = local_27ec + 1) {
      for (local_2b8c = 0; local_2b8c < iVar2; local_2b8c = local_2b8c + 1) {
        local_1648 = (float)*puVar8;
        fStack_1644 = (float)((ulong)*puVar8 >> 0x20);
        fStack_1640 = (float)puVar8[1];
        fStack_163c = (float)((ulong)puVar8[1] >> 0x20);
        local_1658 = (float)*local_27c0;
        fStack_1654 = (float)((ulong)*local_27c0 >> 0x20);
        fStack_1650 = (float)local_27c0[1];
        fStack_164c = (float)((ulong)local_27c0[1] >> 0x20);
        local_16b8 = (float)puVar8[2];
        fStack_16b4 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_16b0 = (float)puVar8[3];
        fStack_16ac = (float)((ulong)puVar8[3] >> 0x20);
        local_16c8 = (float)local_27c0[2];
        fStack_16c4 = (float)((ulong)local_27c0[2] >> 0x20);
        fStack_16c0 = (float)local_27c0[3];
        fStack_16bc = (float)((ulong)local_27c0[3] >> 0x20);
        local_1728 = (float)puVar8[4];
        fStack_1724 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_1720 = (float)puVar8[5];
        fStack_171c = (float)((ulong)puVar8[5] >> 0x20);
        local_1738 = (float)local_27c0[4];
        fStack_1734 = (float)((ulong)local_27c0[4] >> 0x20);
        fStack_1730 = (float)local_27c0[5];
        fStack_172c = (float)((ulong)local_27c0[5] >> 0x20);
        local_1798 = (float)puVar8[6];
        fStack_1794 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_1790 = (float)puVar8[7];
        fStack_178c = (float)((ulong)puVar8[7] >> 0x20);
        local_17a8 = (float)local_27c0[6];
        fStack_17a4 = (float)((ulong)local_27c0[6] >> 0x20);
        fStack_17a0 = (float)local_27c0[7];
        fStack_179c = (float)((ulong)local_27c0[7] >> 0x20);
        local_1808 = (float)puVar8[8];
        fStack_1804 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_1800 = (float)puVar8[9];
        fStack_17fc = (float)((ulong)puVar8[9] >> 0x20);
        local_1818 = (float)local_27c0[8];
        fStack_1814 = (float)((ulong)local_27c0[8] >> 0x20);
        fStack_1810 = (float)local_27c0[9];
        fStack_180c = (float)((ulong)local_27c0[9] >> 0x20);
        local_1878 = (float)puVar8[10];
        fStack_1874 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_1870 = (float)puVar8[0xb];
        fStack_186c = (float)((ulong)puVar8[0xb] >> 0x20);
        local_1888 = (float)*local_27c8;
        fStack_1884 = (float)((ulong)*local_27c8 >> 0x20);
        fStack_1880 = (float)local_27c8[1];
        fStack_187c = (float)((ulong)local_27c8[1] >> 0x20);
        local_18e8 = (float)puVar8[0xc];
        fStack_18e4 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_18e0 = (float)puVar8[0xd];
        fStack_18dc = (float)((ulong)puVar8[0xd] >> 0x20);
        local_18f8 = (float)local_27c8[2];
        fStack_18f4 = (float)((ulong)local_27c8[2] >> 0x20);
        fStack_18f0 = (float)local_27c8[3];
        fStack_18ec = (float)((ulong)local_27c8[3] >> 0x20);
        local_1958 = (float)puVar8[0xe];
        fStack_1954 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_1950 = (float)puVar8[0xf];
        fStack_194c = (float)((ulong)puVar8[0xf] >> 0x20);
        local_1968 = (float)local_27c8[4];
        fStack_1964 = (float)((ulong)local_27c8[4] >> 0x20);
        fStack_1960 = (float)local_27c8[5];
        fStack_195c = (float)((ulong)local_27c8[5] >> 0x20);
        local_19c8 = (float)puVar8[0x10];
        fStack_19c4 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_19c0 = (float)puVar8[0x11];
        fStack_19bc = (float)((ulong)puVar8[0x11] >> 0x20);
        local_19d8 = (float)local_27c8[6];
        fStack_19d4 = (float)((ulong)local_27c8[6] >> 0x20);
        fStack_19d0 = (float)local_27c8[7];
        fStack_19cc = (float)((ulong)local_27c8[7] >> 0x20);
        local_1a38 = (float)puVar8[0x12];
        fStack_1a34 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_1a30 = (float)puVar8[0x13];
        fStack_1a2c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_1a48 = (float)local_27c8[8];
        fStack_1a44 = (float)((ulong)local_27c8[8] >> 0x20);
        fStack_1a40 = (float)local_27c8[9];
        fStack_1a3c = (float)((ulong)local_27c8[9] >> 0x20);
        local_1aa8 = (float)puVar8[0x14];
        fStack_1aa4 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_1aa0 = (float)puVar8[0x15];
        fStack_1a9c = (float)((ulong)puVar8[0x15] >> 0x20);
        local_1ab8 = (float)*local_27d0;
        fStack_1ab4 = (float)((ulong)*local_27d0 >> 0x20);
        fStack_1ab0 = (float)local_27d0[1];
        fStack_1aac = (float)((ulong)local_27d0[1] >> 0x20);
        local_1b18 = (float)puVar8[0x16];
        fStack_1b14 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_1b10 = (float)puVar8[0x17];
        fStack_1b0c = (float)((ulong)puVar8[0x17] >> 0x20);
        local_1b28 = (float)local_27d0[2];
        fStack_1b24 = (float)((ulong)local_27d0[2] >> 0x20);
        fStack_1b20 = (float)local_27d0[3];
        fStack_1b1c = (float)((ulong)local_27d0[3] >> 0x20);
        local_1b88 = (float)puVar8[0x18];
        fStack_1b84 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_1b80 = (float)puVar8[0x19];
        fStack_1b7c = (float)((ulong)puVar8[0x19] >> 0x20);
        local_1b98 = (float)local_27d0[4];
        fStack_1b94 = (float)((ulong)local_27d0[4] >> 0x20);
        fStack_1b90 = (float)local_27d0[5];
        fStack_1b8c = (float)((ulong)local_27d0[5] >> 0x20);
        local_1bf8 = (float)puVar8[0x1a];
        fStack_1bf4 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_1bf0 = (float)puVar8[0x1b];
        fStack_1bec = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_1c08 = (float)local_27d0[6];
        fStack_1c04 = (float)((ulong)local_27d0[6] >> 0x20);
        fStack_1c00 = (float)local_27d0[7];
        fStack_1bfc = (float)((ulong)local_27d0[7] >> 0x20);
        local_1c68 = (float)puVar8[0x1c];
        fStack_1c64 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_1c60 = (float)puVar8[0x1d];
        fStack_1c5c = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_1c78 = (float)local_27d0[8];
        fStack_1c74 = (float)((ulong)local_27d0[8] >> 0x20);
        fStack_1c70 = (float)local_27d0[9];
        fStack_1c6c = (float)((ulong)local_27d0[9] >> 0x20);
        local_1cd8 = (float)puVar8[0x1e];
        fStack_1cd4 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_1cd0 = (float)puVar8[0x1f];
        fStack_1ccc = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_1ce8 = (float)*local_27d8;
        fStack_1ce4 = (float)((ulong)*local_27d8 >> 0x20);
        fStack_1ce0 = (float)local_27d8[1];
        fStack_1cdc = (float)((ulong)local_27d8[1] >> 0x20);
        local_1d48 = (float)puVar8[0x20];
        fStack_1d44 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_1d40 = (float)puVar8[0x21];
        fStack_1d3c = (float)((ulong)puVar8[0x21] >> 0x20);
        local_1d58 = (float)local_27d8[2];
        fStack_1d54 = (float)((ulong)local_27d8[2] >> 0x20);
        fStack_1d50 = (float)local_27d8[3];
        fStack_1d4c = (float)((ulong)local_27d8[3] >> 0x20);
        local_1db8 = (float)puVar8[0x22];
        fStack_1db4 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_1db0 = (float)puVar8[0x23];
        fStack_1dac = (float)((ulong)puVar8[0x23] >> 0x20);
        local_1dc8 = (float)local_27d8[4];
        fStack_1dc4 = (float)((ulong)local_27d8[4] >> 0x20);
        fStack_1dc0 = (float)local_27d8[5];
        fStack_1dbc = (float)((ulong)local_27d8[5] >> 0x20);
        local_1e28 = (float)puVar8[0x24];
        fStack_1e24 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_1e20 = (float)puVar8[0x25];
        fStack_1e1c = (float)((ulong)puVar8[0x25] >> 0x20);
        local_1e38 = (float)local_27d8[6];
        fStack_1e34 = (float)((ulong)local_27d8[6] >> 0x20);
        fStack_1e30 = (float)local_27d8[7];
        fStack_1e2c = (float)((ulong)local_27d8[7] >> 0x20);
        local_1e98 = (float)puVar8[0x26];
        fStack_1e94 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_1e90 = (float)puVar8[0x27];
        fStack_1e8c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_1ea8 = (float)local_27d8[8];
        fStack_1ea4 = (float)((ulong)local_27d8[8] >> 0x20);
        fStack_1ea0 = (float)local_27d8[9];
        fStack_1e9c = (float)((ulong)local_27d8[9] >> 0x20);
        local_1f08 = (float)puVar8[0x28];
        fStack_1f04 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_1f00 = (float)puVar8[0x29];
        fStack_1efc = (float)((ulong)puVar8[0x29] >> 0x20);
        local_1f18 = (float)*local_27e0;
        fStack_1f14 = (float)((ulong)*local_27e0 >> 0x20);
        fStack_1f10 = (float)local_27e0[1];
        fStack_1f0c = (float)((ulong)local_27e0[1] >> 0x20);
        local_1f78 = (float)puVar8[0x2a];
        fStack_1f74 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_1f70 = (float)puVar8[0x2b];
        fStack_1f6c = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_1f88 = (float)local_27e0[2];
        fStack_1f84 = (float)((ulong)local_27e0[2] >> 0x20);
        fStack_1f80 = (float)local_27e0[3];
        fStack_1f7c = (float)((ulong)local_27e0[3] >> 0x20);
        local_1fe8 = (float)puVar8[0x2c];
        fStack_1fe4 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_1fe0 = (float)puVar8[0x2d];
        fStack_1fdc = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_1ff8 = (float)local_27e0[4];
        fStack_1ff4 = (float)((ulong)local_27e0[4] >> 0x20);
        fStack_1ff0 = (float)local_27e0[5];
        fStack_1fec = (float)((ulong)local_27e0[5] >> 0x20);
        local_2058 = (float)puVar8[0x2e];
        fStack_2054 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_2050 = (float)puVar8[0x2f];
        fStack_204c = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_2068 = (float)local_27e0[6];
        fStack_2064 = (float)((ulong)local_27e0[6] >> 0x20);
        fStack_2060 = (float)local_27e0[7];
        fStack_205c = (float)((ulong)local_27e0[7] >> 0x20);
        local_20c8 = (float)puVar8[0x30];
        fStack_20c4 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_20c0 = (float)puVar8[0x31];
        fStack_20bc = (float)((ulong)puVar8[0x31] >> 0x20);
        local_20d8 = (float)local_27e0[8];
        fStack_20d4 = (float)((ulong)local_27e0[8] >> 0x20);
        fStack_20d0 = (float)local_27e0[9];
        fStack_20cc = (float)((ulong)local_27e0[9] >> 0x20);
        *local_2768 = CONCAT44(fStack_20c4 * fStack_20d4 +
                               fStack_2054 * fStack_2064 +
                               fStack_1fe4 * fStack_1ff4 +
                               fStack_1f74 * fStack_1f84 +
                               fStack_1f04 * fStack_1f14 +
                               fStack_1e94 * fStack_1ea4 +
                               fStack_1e24 * fStack_1e34 +
                               fStack_1db4 * fStack_1dc4 +
                               fStack_1d44 * fStack_1d54 +
                               fStack_1cd4 * fStack_1ce4 +
                               fStack_1c64 * fStack_1c74 +
                               fStack_1bf4 * fStack_1c04 +
                               fStack_1b84 * fStack_1b94 +
                               fStack_1b14 * fStack_1b24 +
                               fStack_1aa4 * fStack_1ab4 +
                               fStack_1a34 * fStack_1a44 +
                               fStack_19c4 * fStack_19d4 +
                               fStack_1954 * fStack_1964 +
                               fStack_18e4 * fStack_18f4 +
                               fStack_1874 * fStack_1884 +
                               fStack_1804 * fStack_1814 +
                               fStack_1794 * fStack_17a4 +
                               fStack_1724 * fStack_1734 +
                               fStack_16b4 * fStack_16c4 + fStack_1644 * fStack_1654 + fStack_94,
                               local_20c8 * local_20d8 +
                               local_2058 * local_2068 +
                               local_1fe8 * local_1ff8 +
                               local_1f78 * local_1f88 +
                               local_1f08 * local_1f18 +
                               local_1e98 * local_1ea8 +
                               local_1e28 * local_1e38 +
                               local_1db8 * local_1dc8 +
                               local_1d48 * local_1d58 +
                               local_1cd8 * local_1ce8 +
                               local_1c68 * local_1c78 +
                               local_1bf8 * local_1c08 +
                               local_1b88 * local_1b98 +
                               local_1b18 * local_1b28 +
                               local_1aa8 * local_1ab8 +
                               local_1a38 * local_1a48 +
                               local_19c8 * local_19d8 +
                               local_1958 * local_1968 +
                               local_18e8 * local_18f8 +
                               local_1878 * local_1888 +
                               local_1808 * local_1818 +
                               local_1798 * local_17a8 +
                               local_1728 * local_1738 +
                               local_16b8 * local_16c8 + local_1648 * local_1658 + local_98);
        local_2768[1] =
             CONCAT44(fStack_20bc * fStack_20cc +
                      fStack_204c * fStack_205c +
                      fStack_1fdc * fStack_1fec +
                      fStack_1f6c * fStack_1f7c +
                      fStack_1efc * fStack_1f0c +
                      fStack_1e8c * fStack_1e9c +
                      fStack_1e1c * fStack_1e2c +
                      fStack_1dac * fStack_1dbc +
                      fStack_1d3c * fStack_1d4c +
                      fStack_1ccc * fStack_1cdc +
                      fStack_1c5c * fStack_1c6c +
                      fStack_1bec * fStack_1bfc +
                      fStack_1b7c * fStack_1b8c +
                      fStack_1b0c * fStack_1b1c +
                      fStack_1a9c * fStack_1aac +
                      fStack_1a2c * fStack_1a3c +
                      fStack_19bc * fStack_19cc +
                      fStack_194c * fStack_195c +
                      fStack_18dc * fStack_18ec +
                      fStack_186c * fStack_187c +
                      fStack_17fc * fStack_180c +
                      fStack_178c * fStack_179c +
                      fStack_171c * fStack_172c +
                      fStack_16ac * fStack_16bc + fStack_163c * fStack_164c + fStack_8c,
                      fStack_20c0 * fStack_20d0 +
                      fStack_2050 * fStack_2060 +
                      fStack_1fe0 * fStack_1ff0 +
                      fStack_1f70 * fStack_1f80 +
                      fStack_1f00 * fStack_1f10 +
                      fStack_1e90 * fStack_1ea0 +
                      fStack_1e20 * fStack_1e30 +
                      fStack_1db0 * fStack_1dc0 +
                      fStack_1d40 * fStack_1d50 +
                      fStack_1cd0 * fStack_1ce0 +
                      fStack_1c60 * fStack_1c70 +
                      fStack_1bf0 * fStack_1c00 +
                      fStack_1b80 * fStack_1b90 +
                      fStack_1b10 * fStack_1b20 +
                      fStack_1aa0 * fStack_1ab0 +
                      fStack_1a30 * fStack_1a40 +
                      fStack_19c0 * fStack_19d0 +
                      fStack_1950 * fStack_1960 +
                      fStack_18e0 * fStack_18f0 +
                      fStack_1870 * fStack_1880 +
                      fStack_1800 * fStack_1810 +
                      fStack_1790 * fStack_17a0 +
                      fStack_1720 * fStack_1730 +
                      fStack_16b0 * fStack_16c0 + fStack_1640 * fStack_1650 + fStack_90);
        local_2768 = local_2768 + 2;
        local_27c0 = local_27c0 + 2;
        local_27c8 = local_27c8 + 2;
        local_27d0 = local_27d0 + 2;
        local_27d8 = local_27d8 + 2;
        local_27e0 = local_27e0 + 2;
      }
      local_27c0 = local_27c0 + 8;
      local_27c8 = local_27c8 + 8;
      local_27d0 = local_27d0 + 8;
      local_27d8 = local_27d8 + 8;
      local_27e0 = local_27e0 + 8;
    }
  }
  return;
}

Assistant:

static void convdw5x5s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);
        const float* r5 = img0.row(5);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;
                __m128 _sum1 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k03, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k04, _r14, _sum1);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k13, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k14, _r24, _sum1);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r32, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k23, _r33, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k24, _r34, _sum1);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k30, _r40, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k31, _r41, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k32, _r42, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k33, _r43, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k34, _r44, _sum1);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                __m128 _r50 = _mm_load_ps(r5);
                __m128 _r51 = _mm_load_ps(r5 + 4);
                __m128 _r52 = _mm_load_ps(r5 + 4 * 2);
                __m128 _r53 = _mm_load_ps(r5 + 4 * 3);
                __m128 _r54 = _mm_load_ps(r5 + 4 * 4);

                _sum1 = _mm_comp_fmadd_ps(_k40, _r50, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k41, _r51, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k42, _r52, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k43, _r53, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k44, _r54, _sum1);

                _mm_store_ps(outptr0, _sum0);
                _mm_store_ps(outptr1, _sum1);

                outptr0 += 4;
                outptr1 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
                r5 += 4;
            }

            r0 += 4 * 4 + w * 4;
            r1 += 4 * 4 + w * 4;
            r2 += 4 * 4 + w * 4;
            r3 += 4 * 4 + w * 4;
            r4 += 4 * 4 + w * 4;
            r5 += 4 * 4 + w * 4;

            outptr0 += outw * 4;
            outptr1 += outw * 4;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;
            }

            r0 += 4 * 4;
            r1 += 4 * 4;
            r2 += 4 * 4;
            r3 += 4 * 4;
            r4 += 4 * 4;
        }
    }
}